

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Sigmoid_x86::forward_inplace(Sigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    do {
      pfVar8 = (float *)(bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar6 < 4) {
        uVar5 = 0;
      }
      else {
        iVar4 = 3;
        do {
          auVar10._0_8_ = *(ulong *)pfVar8 ^ 0x8000000080000000;
          auVar10._8_4_ = -pfVar8[2];
          auVar10._12_4_ = -pfVar8[3];
          auVar2._8_4_ = 0x42b0c0a5;
          auVar2._0_8_ = 0x42b0c0a542b0c0a5;
          auVar2._12_4_ = 0x42b0c0a5;
          auVar11 = minps(auVar10,auVar2);
          auVar3._8_4_ = 0xc2b0c0a5;
          auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar3._12_4_ = 0xc2b0c0a5;
          auVar11 = maxps(auVar11,auVar3);
          fVar17 = auVar11._0_4_ * 1.442695 + 0.5;
          fVar19 = auVar11._4_4_ * 1.442695 + 0.5;
          fVar21 = auVar11._8_4_ * 1.442695 + 0.5;
          fVar22 = auVar11._12_4_ * 1.442695 + 0.5;
          fVar13 = (float)(int)fVar17;
          fVar14 = (float)(int)fVar19;
          fVar15 = (float)(int)fVar21;
          fVar16 = (float)(int)fVar22;
          fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
          fVar14 = fVar14 - (float)(-(uint)(fVar19 < fVar14) & 0x3f800000);
          fVar15 = fVar15 - (float)(-(uint)(fVar21 < fVar15) & 0x3f800000);
          fVar16 = fVar16 - (float)(-(uint)(fVar22 < fVar16) & 0x3f800000);
          fVar17 = fVar13 * -0.6931472 + auVar11._0_4_;
          fVar19 = fVar14 * -0.6931472 + auVar11._4_4_;
          fVar21 = fVar15 * -0.6931472 + auVar11._8_4_;
          fVar22 = fVar16 * -0.6931472 + auVar11._12_4_;
          auVar12._0_4_ = fVar17 * fVar17;
          auVar12._4_4_ = fVar19 * fVar19;
          auVar12._8_4_ = fVar21 * fVar21;
          auVar12._12_4_ = fVar22 * fVar22;
          fVar18 = (float)((int)fVar13 * 0x800000 + 0x3f800000) *
                   (fVar17 + 1.0 +
                   (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                     0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * auVar12._0_4_) + 1.0;
          fVar20 = (float)((int)fVar14 * 0x800000 + 0x3f800000) *
                   (fVar19 + 1.0 +
                   (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                     0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * auVar12._4_4_) + 1.0;
          fVar15 = (float)((int)fVar15 * 0x800000 + 0x3f800000) *
                   (fVar21 + 1.0 +
                   (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                     0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * auVar12._8_4_) + 1.0;
          fVar21 = (float)((int)fVar16 * 0x800000 + 0x3f800000) *
                   (fVar22 + 1.0 +
                   (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                     0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * auVar12._12_4_) + 1.0;
          auVar11._4_4_ = fVar20;
          auVar11._0_4_ = fVar18;
          auVar11._8_4_ = fVar15;
          auVar11._12_4_ = fVar21;
          auVar11 = rcpps(auVar12,auVar11);
          fVar13 = auVar11._0_4_;
          fVar17 = auVar11._4_4_;
          fVar14 = auVar11._8_4_;
          fVar19 = auVar11._12_4_;
          *pfVar8 = (1.0 - fVar18 * fVar13) * fVar13 + fVar13;
          pfVar8[1] = (1.0 - fVar20 * fVar17) * fVar17 + fVar17;
          pfVar8[2] = (1.0 - fVar15 * fVar14) * fVar14 + fVar14;
          pfVar8[3] = (1.0 - fVar21 * fVar19) * fVar19 + fVar19;
          pfVar8 = pfVar8 + 4;
          iVar4 = iVar4 + 4;
          uVar5 = uVar6 & 0xfffffffc;
        } while (iVar4 < (int)uVar6);
      }
      if (uVar6 - uVar5 != 0 && (int)uVar5 <= (int)uVar6) {
        lVar9 = 0;
        do {
          fVar13 = expf(-pfVar8[lVar9]);
          pfVar8[lVar9] = 1.0 / (fVar13 + 1.0);
          lVar9 = lVar9 + 1;
        } while (uVar6 - uVar5 != (int)lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int Sigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}